

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_cont_helpers.hpp
# Opt level: O0

bool asio_handler_cont_helpers::
     is_continuation<asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>>
               (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
                *context)

{
  bool bVar1;
  
  bVar1 = asio::detail::
          asio_handler_is_continuation<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>
                    (context);
  return bVar1;
}

Assistant:

inline bool is_continuation(Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  return false;
#else
  using asio::asio_handler_is_continuation;
  return asio_handler_is_continuation(
      asio::detail::addressof(context));
#endif
}